

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_escaped_char<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char v)

{
  bool bVar1;
  char in_SIL;
  buffer<char> *in_RDI;
  find_escape_result<char> *in_stack_00000030;
  basic_appender<char> in_stack_00000038;
  char v_array [1];
  char in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  basic_appender<char> local_58;
  basic_appender<char> local_50;
  undefined1 *local_48;
  char *local_40;
  int local_38;
  buffer<char> *local_30;
  buffer<char> *local_28;
  basic_appender<char> local_20;
  undefined1 local_12;
  char local_11;
  basic_appender<char> local_10 [2];
  
  local_11 = in_SIL;
  local_10[0].container = in_RDI;
  local_20 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_20);
  basic_appender<char>::operator=
            ((basic_appender<char> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9f);
  bVar1 = needs_escape(0x13037a);
  if (((bVar1) && (local_11 != '\"')) || (local_11 == '\'')) {
    local_30 = local_10[0].container;
    local_48 = &local_12;
    local_40 = &local_11;
    local_38 = (int)local_11;
    local_28 = (buffer<char> *)
               write_escaped_cp<fmt::v11::basic_appender<char>,char>
                         (in_stack_00000038,in_stack_00000030);
    local_10[0] = (basic_appender<char>)local_28;
  }
  else {
    local_50 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_50);
    basic_appender<char>::operator=
              ((basic_appender<char> *)CONCAT17(local_11,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9f);
    in_stack_ffffffffffffffa7 = local_11;
  }
  local_58 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_58);
  basic_appender<char>::operator=
            ((basic_appender<char> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9f);
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}